

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int hash_iter(HashTable *table,void *key,void **_value,void **iter)

{
  HashItem **ppHVar1;
  uint32 uVar2;
  int iVar3;
  HashItem *local_38;
  HashItem *item;
  void **iter_local;
  void **_value_local;
  void *key_local;
  HashTable *table_local;
  
  if (*iter == (void *)0x0) {
    ppHVar1 = table->table;
    uVar2 = calc_hash(table,key);
    local_38 = ppHVar1[uVar2];
  }
  else {
    local_38 = *(HashItem **)((long)*iter + 0x10);
  }
  while( true ) {
    if (local_38 == (HashItem *)0x0) {
      *_value = (void *)0x0;
      *iter = (void *)0x0;
      return 0;
    }
    iVar3 = (*table->keymatch)(key,local_38->key,table->data);
    if (iVar3 != 0) break;
    local_38 = local_38->next;
  }
  *_value = local_38->value;
  *iter = local_38;
  return 1;
}

Assistant:

int hash_iter(const HashTable *table, const void *key,
              const void **_value, void **iter)
{
    HashItem *item = (HashItem *) *iter;
    if (item == NULL)
        item = table->table[calc_hash(table, key)];
    else
        item = item->next;

    while (item != NULL)
    {
        if (table->keymatch(key, item->key, table->data))
        {
            *_value = item->value;
            *iter = item;
            return 1;
        } // if
        item = item->next;
    } // while

    // no more matches.
    *_value = NULL;
    *iter = NULL;
    return 0;
}